

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian-branching.hxx
# Opt level: O2

void __thiscall
lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>::setup
          (MaskedHungarianBranching<lineage::heuristics::PartitionGraph> *this)

{
  bool bVar1;
  PartitionGraph *pPVar2;
  long lVar3;
  size_t sVar4;
  pointer pVVar5;
  pointer pAVar6;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  ulong uVar7;
  value_type v;
  vector<unsigned_long,_std::allocator<unsigned_long>_> distance;
  anon_class_8_1_73d94478 withinMaxTimeStep;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> queue;
  size_t local_d0;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_c8;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_c0;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_b8;
  long local_b0;
  size_t local_a8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  anon_class_8_1_73d94478 local_88;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  
  local_b0 = HungarianBranching<lineage::heuristics::PartitionGraph>::getFrame
                       (&this->super_HungarianBranching<lineage::heuristics::PartitionGraph>,
                        this->A_);
  std::queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  queue<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
            ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &local_80);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_80,&this->A_);
  pPVar2 = (this->super_HungarianBranching<lineage::heuristics::PartitionGraph>).
           super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.graph_;
  if ((pPVar2->partitions_).
      super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[this->B_]._M_h._M_element_count != 0) {
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_80,&this->B_);
    pPVar2 = (this->super_HungarianBranching<lineage::heuristics::PartitionGraph>).
             super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.graph_;
  }
  local_88.centerFrame = -1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a0,
             (long)(pPVar2->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                   vertices_.
                   super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pPVar2->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                   vertices_.
                   super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6,(value_type_conflict *)&local_88,
             (allocator_type *)&local_d0);
  local_a0._M_impl.super__Vector_impl_data._M_start[this->A_] = 0;
  local_a0._M_impl.super__Vector_impl_data._M_start[this->B_] = 0;
  local_88.centerFrame = local_b0;
  local_b8 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->third_;
  local_c0 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->second_;
  local_c8 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->first_;
  while (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_d0 = *local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front
              ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_80);
    lVar3 = HungarianBranching<lineage::heuristics::PartitionGraph>::getFrame
                      (&this->super_HungarianBranching<lineage::heuristics::PartitionGraph>,local_d0
                      );
    this_00 = local_b8;
    if (lVar3 == local_b0) {
      this_00 = local_c0;
    }
    if (lVar3 < local_b0) {
      this_00 = local_c8;
    }
    std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long_const&>
              (this_00,&local_d0);
    if (local_a0._M_impl.super__Vector_impl_data._M_start[local_d0] < this->maxDistance_) {
      pVVar5 = (((this->super_HungarianBranching<lineage::heuristics::PartitionGraph>).
                 super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.graph_)->
               super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
               super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = local_a0._M_impl.super__Vector_impl_data._M_start[local_d0] + 1;
      for (pAVar6 = *(pointer *)&((Adjacencies *)((long)(pVVar5 + local_d0) + 0x20))->vector_;
          pAVar6 != *(pointer *)((long)(pVVar5 + local_d0) + 0x28); pAVar6 = pAVar6 + 1) {
        sVar4 = HungarianBranching<lineage::heuristics::PartitionGraph>::getFrame
                          (&this->super_HungarianBranching<lineage::heuristics::PartitionGraph>,
                           pAVar6->vertex_);
        bVar1 = setup::anon_class_8_1_73d94478::operator()(&local_88,sVar4);
        if (bVar1) {
          if (uVar7 < local_a0._M_impl.super__Vector_impl_data._M_start[pAVar6->vertex_]) {
            local_a0._M_impl.super__Vector_impl_data._M_start[pAVar6->vertex_] = uVar7;
            local_a8 = pAVar6->vertex_;
            std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_80,&local_a8);
          }
        }
        pVVar5 = (((this->super_HungarianBranching<lineage::heuristics::PartitionGraph>).
                   super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.graph_)->
                 super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
                 super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      for (pAVar6 = *(pointer *)&pVVar5[local_d0].from_;
          pAVar6 != *(pointer *)((long)(pVVar5 + local_d0) + 8); pAVar6 = pAVar6 + 1) {
        sVar4 = HungarianBranching<lineage::heuristics::PartitionGraph>::getFrame
                          (&this->super_HungarianBranching<lineage::heuristics::PartitionGraph>,
                           pAVar6->vertex_);
        bVar1 = setup::anon_class_8_1_73d94478::operator()(&local_88,sVar4);
        if (bVar1) {
          if (uVar7 < local_a0._M_impl.super__Vector_impl_data._M_start[pAVar6->vertex_]) {
            local_a0._M_impl.super__Vector_impl_data._M_start[pAVar6->vertex_] = uVar7;
            local_a8 = pAVar6->vertex_;
            std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_80,&local_a8);
          }
        }
        pVVar5 = (((this->super_HungarianBranching<lineage::heuristics::PartitionGraph>).
                   super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.graph_)->
                 super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
                 super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
    }
  }
  remove_duplicates<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8);
  remove_duplicates<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0);
  remove_duplicates<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a0);
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_80);
  return;
}

Assistant:

inline void
MaskedHungarianBranching<GRAPH>::setup()
{
    const auto centerFrame = this->getFrame(A_);

    std::queue<size_t> queue;
    queue.push(A_);

    if (!this->getGraph().partitions_[B_].empty())
        queue.push(B_);

    std::vector<size_t> distance(this->getGraph().numberOfVertices(),
                                 std::numeric_limits<size_t>::max());
    distance[A_] = 0;
    distance[B_] = 0;

    auto withinMaxTimeStep = [=](size_t other) {
        if (other == centerFrame)
            return true;
        if (other < centerFrame && (centerFrame - other) == 1) {
            return true;
        } else if (other > centerFrame && (other - centerFrame) == 1) {
            return true;
        } else {
            return false;
        }
    };

    while (!queue.empty()) {

        const auto v = queue.front();
        queue.pop();

        // put the node in the correct set of nodes.
        auto const& frame = this->getFrame(v);
        if (frame < centerFrame)
            first_.emplace_back(v);
        else if (frame == centerFrame)
            second_.emplace_back(v);
        else
            third_.emplace_back(v);

        auto const currentDistance = distance[v];
        if (currentDistance >= maxDistance_) {
            continue;
        }

        // outgoing edges ...
        for (auto it = this->getGraph().verticesFromVertexBegin(v);
             it != this->getGraph().verticesFromVertexEnd(v); ++it) {

            if (!withinMaxTimeStep(this->getFrame(*it))) {
                continue;
            }

            if (distance[*it] > currentDistance + 1) {
                distance[*it] = currentDistance + 1;
                queue.push(*it);
            }
        }

        // ... and incoming edges.
        for (auto it = this->getGraph().verticesToVertexBegin(v);
             it != this->getGraph().verticesToVertexEnd(v); ++it) {

            if (!withinMaxTimeStep(this->getFrame(*it))) {
                continue;
            }

            if (distance[*it] > currentDistance + 1) {
                distance[*it] = currentDistance + 1;
                queue.push(*it);
            }
        }
    }

    // just be sure that there are no duplicates.
    remove_duplicates(first_);
    remove_duplicates(second_);
    remove_duplicates(third_);
}